

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O0

bool __thiscall LPCMStreamReader::beforeFileCloseEvent(LPCMStreamReader *this,File *file)

{
  int iVar1;
  int64_t iVar2;
  int local_2c;
  long lStack_28;
  uint32_t dataSize;
  int64_t fileSize;
  File *file_local;
  LPCMStreamReader *this_local;
  
  fileSize = (int64_t)file;
  file_local = (File *)this;
  (*(file->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[6])();
  lStack_28 = 0;
  File::size((File *)fileSize,&stack0xffffffffffffffd8);
  if (lStack_28 < 0x100000000) {
    local_2c = (int)lStack_28 + -8;
    iVar2 = File::seek((File *)fileSize,4,smBegin);
    if (iVar2 == -1) {
      return false;
    }
    iVar1 = (**(code **)(*(long *)fileSize + 0x28))(fileSize,&local_2c,4);
    if (iVar1 != 4) {
      return false;
    }
    iVar2 = File::seek((File *)fileSize,0x40,smBegin);
    if (iVar2 == -1) {
      return false;
    }
    local_2c = (int)lStack_28 + -0x44;
    iVar1 = (**(code **)(*(long *)fileSize + 0x28))(fileSize,&local_2c,4);
    if (iVar1 != 4) {
      return false;
    }
  }
  return true;
}

Assistant:

bool LPCMStreamReader::beforeFileCloseEvent(File& file)
{
    file.sync();
    int64_t fileSize = 0;
    file.size(&fileSize);
    if (fileSize <= UINT_MAX)
    {
        uint32_t dataSize = static_cast<uint32_t>(fileSize) - 8;
        if (file.seek(4, File::SeekMethod::smBegin) == -1)
            return false;
        if (file.write(&dataSize, 4) != 4)
            return false;
        if (file.seek(64, File::SeekMethod::smBegin) == -1)
            return false;
        dataSize = static_cast<uint32_t>(fileSize) - 68;
        if (file.write(&dataSize, 4) != 4)
            return false;
    }
    return true;
}